

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall
lan::db::set_bit<double>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,double value)

{
  pointer pcVar1;
  double *pdVar2;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + name->_M_string_length);
  db_bit::~db_bit(var);
  std::__cxx11::string::_M_assign((string *)var);
  var->type = type;
  var->con = context;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pdVar2 = (double *)operator_new(8);
  *pdVar2 = value;
  var->data = pdVar2;
  return true;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }